

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
ManySubcommands_Required4Failure_Test::TestBody(ManySubcommands_Required4Failure_Test *this)

{
  bool bVar1;
  AssertHelper local_48;
  Message local_40 [2];
  RequiredError *anon_var_0;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ManySubcommands_Required4Failure_Test *this_local;
  
  gtest_msg.value = (char *)this;
  CLI::App::require_subcommand(&(this->super_ManySubcommands).super_TApp.app,4);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((local_19 & 1) != 0) {
      return;
    }
    pcStack_18 = 
    "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_40);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x2ad,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_48,local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  testing::Message::~Message(local_40);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required4Failure) {
    app.require_subcommand(4);

    EXPECT_THROW(run(), CLI::RequiredError);
}